

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_mutex.c
# Opt level: O1

uint s_mutex_cancel_dead_waiting_tasks_(void)

{
  s_list_t *list;
  s_list_t *psVar1;
  s_list_t *list_00;
  s_list_t *psVar2;
  uint uVar3;
  s_list_t *list_01;
  long *in_FS_OFFSET;
  
  list_01 = (s_list_t *)(*in_FS_OFFSET + -200);
  list = s_list_get_next(list_01);
  if (list == list_01) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      psVar1 = s_list_get_next(list);
      s_list_detach(list);
      list_00 = s_list_get_next(list + -1);
      while (list_00 != list + -1) {
        psVar2 = s_list_get_next(list_00);
        s_task_cancel_wait(list_00);
        uVar3 = uVar3 + 1;
        list_00 = psVar2;
      }
      list = psVar1;
    } while (psVar1 != list_01);
  }
  if (uVar3 != 0) {
    s_mutex_cancel_dead_waiting_tasks__cold_1();
  }
  return uVar3;
}

Assistant:

unsigned int s_mutex_cancel_dead_waiting_tasks_() {
    s_list_t *next_mutex;
    s_list_t *this_mutex;
    unsigned int ret = 0;
    /* Check all mutexs */
    for(this_mutex = s_list_get_next(&g_globals.waiting_mutexes);
        this_mutex != &g_globals.waiting_mutexes;
        this_mutex = next_mutex) {
        s_list_t *next_task;
        s_list_t *this_task;
        s_mutex_t *mutex;
        
        next_mutex = s_list_get_next(this_mutex);
        s_list_detach(this_mutex);
        mutex = GET_PARENT_ADDR(this_mutex, s_mutex_t, self);
        
        /* Check all tasks blocked on this mutex */
        for(this_task = s_list_get_next(&mutex->wait_list);
            this_task != &mutex->wait_list;
            this_task = next_task) {
            next_task = s_list_get_next(this_task);
                    
            s_task_t *task = GET_PARENT_ADDR(this_task, s_task_t, node);
            s_task_cancel_wait(task);
            ++ret;
        }
    }

#ifndef NDEBUG
    if (ret > 0) {
        fprintf(stderr, "error: cancel dead tasks waiting on mutex!\n");
    }
#endif

    return ret;
}